

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O1

unique_ptr<pg::Game,_std::default_delete<pg::Game>_> __thiscall
pg::Game::extract_subgame
          (Game *this,bitset *mask,vector<int,_std::allocator<int>_> *subgame_to_game)

{
  pointer piVar1;
  long *plVar2;
  size_t sVar3;
  string *psVar4;
  _Head_base<0UL,_pg::Game_*,_false> _Var5;
  Game *pGVar6;
  mapped_type_conflict *pmVar7;
  ostream *poVar8;
  vector<int,_std::allocator<int>_> *in_RCX;
  int iVar9;
  size_t sVar10;
  _Alloc_hider _Var11;
  bool bVar12;
  long lVar13;
  int *piVar14;
  int iVar15;
  ulong uVar17;
  uint64_t *puVar18;
  key_type_conflict1 *__k;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> game_to_subgame;
  value_type_conflict3 local_d8;
  int local_d4;
  size_t local_d0;
  _Head_base<0UL,_pg::Game_*,_false> local_c8;
  bitset *local_c0;
  vector<int,_std::allocator<int>_> *local_b8;
  int local_ac;
  Game *local_a8;
  string local_a0;
  string local_80;
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_60;
  ulong uVar16;
  
  local_b8 = in_RCX;
  local_d0 = bitset::count((bitset *)subgame_to_game);
  if ((long)mask->_bits < 1) {
    iVar9 = 0;
  }
  else {
    piVar1 = (subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar18 = (uint64_t *)0x0;
    iVar9 = 0;
    do {
      if ((*(ulong *)(piVar1 + ((ulong)puVar18 >> 6) * 2) >> ((ulong)puVar18 & 0x3f) & 1) != 0) {
        lVar13 = (long)*(int *)(mask[2]._size + (long)puVar18 * 4);
        iVar15 = *(int *)((long)mask[2]._bits + lVar13 * 4);
        if (iVar15 == -1) {
          bVar12 = true;
        }
        else {
          piVar14 = (int *)((long)mask[2]._bits + lVar13 * 4 + 4);
          bVar12 = true;
          do {
            uVar16 = (ulong)iVar15;
            uVar17 = *(ulong *)(piVar1 + (uVar16 >> 6) * 2);
            iVar9 = iVar9 + (uint)((uVar17 >> (uVar16 & 0x3f) & 1) != 0);
            if ((uVar17 >> (uVar16 & 0x3f) & 1) != 0) {
              bVar12 = false;
            }
            iVar15 = *piVar14;
            piVar14 = piVar14 + 1;
          } while (iVar15 != -1);
        }
        if (bVar12) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"no successor for vertex ",0x18);
          local_60._M_impl.super__Rb_tree_header._M_header._M_color = (_Rb_tree_color)puVar18;
          local_60._M_impl._0_8_ = mask;
          poVar8 = operator<<((ostream *)&std::cerr,(_label_vertex *)&local_60);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," in extract_subgame!",0x14);
          std::endl<char,std::char_traits<char>>(poVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"successors not in subgame:",0x1a);
          lVar13 = (long)*(int *)(mask[2]._size + (long)puVar18 * 4);
          if (*(int *)((long)mask[2]._bits + lVar13 * 4) != -1) {
            piVar14 = (int *)((long)mask[2]._bits + lVar13 * 4 + 4);
            do {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
              local_60._M_impl.super__Rb_tree_header._M_header._M_color = piVar14[-1];
              local_60._M_impl._0_8_ = mask;
              operator<<((ostream *)&std::cerr,(_label_vertex *)&local_60);
              iVar9 = *piVar14;
              piVar14 = piVar14 + 1;
            } while (iVar9 != -1);
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          abort();
        }
      }
      puVar18 = (uint64_t *)((long)puVar18 + 1);
    } while (puVar18 != mask->_bits);
  }
  pGVar6 = (Game *)operator_new(0xaa8);
  Game(pGVar6,(int)local_d0,iVar9);
  this->n_vertices = (long)pGVar6;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8 = 0;
  local_c8._M_head_impl = this;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(local_b8,(size_type)mask->_bits,&local_d8);
  local_d8 = 0;
  local_c0 = mask;
  if (0 < (long)mask->_bits) {
    uVar17 = 0;
    iVar9 = 0;
    do {
      if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start + (uVar17 >> 6) * 2) >> (uVar17 & 0x3f) & 1)
          != 0) {
        (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[iVar9] = (int)uVar17;
        pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                             *)&local_60,&local_d8);
        local_d4 = iVar9 + 1;
        *pmVar7 = iVar9;
        uVar17 = (ulong)local_d8;
        plVar2 = *(long **)(mask[1]._allocsize + uVar17 * 8);
        local_a8 = (Game *)(local_c8._M_head_impl)->n_vertices;
        if (plVar2 == (long *)0x0) {
          local_ac = *(int *)(mask->_bitssize + uVar17 * 4);
          uVar16 = *(ulong *)(mask->_allocsize + (uVar17 >> 6) * 8);
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
          init_vertex(local_a8,iVar9,local_ac,(uint)((uVar16 >> (uVar17 & 0x3f) & 1) != 0),&local_a0
                     );
          psVar4 = &local_a0;
          _Var11._M_p = local_a0._M_dataplus._M_p;
        }
        else {
          iVar15 = *(int *)(mask->_bitssize + uVar17 * 4);
          uVar16 = *(ulong *)(mask->_allocsize + (uVar17 >> 6) * 8);
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_80,*plVar2,plVar2[1] + *plVar2)
          ;
          init_vertex(local_a8,iVar9,iVar15,(uint)((uVar16 >> (uVar17 & 0x3f) & 1) != 0),&local_80);
          psVar4 = &local_80;
          _Var11._M_p = local_80._M_dataplus._M_p;
        }
        mask = local_c0;
        iVar9 = local_d4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var11._M_p != &psVar4->field_2) {
          operator_delete(_Var11._M_p,(psVar4->field_2)._M_allocated_capacity + 1);
          iVar9 = local_d4;
        }
      }
      uVar17 = (long)local_d8 + 1;
      local_d8 = (value_type_conflict3)uVar17;
    } while ((long)uVar17 < (long)mask->_bits);
  }
  _Var5._M_head_impl = local_c8._M_head_impl;
  if (0 < (int)(uint)local_d0) {
    local_d0 = (size_t)((uint)local_d0 & 0x7fffffff);
    sVar10 = 0;
    do {
      iVar9 = (local_b8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[sVar10];
      lVar13 = (_Var5._M_head_impl)->n_vertices;
      *(undefined4 *)(*(long *)(lVar13 + 0x48) + sVar10 * 4) = *(undefined4 *)(lVar13 + 0x90);
      *(undefined4 *)(*(long *)(lVar13 + 0x50) + sVar10 * 4) = 0;
      lVar13 = (long)*(int *)(local_c0[2]._size + (long)iVar9 * 4);
      iVar9 = *(int *)((long)local_c0[2]._bits + lVar13 * 4);
      if (iVar9 != -1) {
        __k = (key_type_conflict1 *)((long)local_c0[2]._bits + lVar13 * 4);
        do {
          if ((*(ulong *)((subgame_to_game->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + ((ulong)(long)iVar9 >> 6) * 2) >>
               ((long)iVar9 & 0x3fU) & 1) != 0) {
            pGVar6 = (Game *)(_Var5._M_head_impl)->n_vertices;
            pmVar7 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                                   *)&local_60,__k);
            e_add(pGVar6,(int)sVar10,*pmVar7);
          }
          iVar9 = __k[1];
          __k = __k + 1;
        } while (iVar9 != -1);
      }
      pGVar6 = (Game *)(_Var5._M_head_impl)->n_vertices;
      if (pGVar6->e_size == pGVar6->e_allocated) {
        e_sizeup(pGVar6);
      }
      sVar3 = pGVar6->e_size;
      pGVar6->e_size = sVar3 + 1;
      pGVar6->_outedges[sVar3] = -1;
      sVar10 = sVar10 + 1;
    } while (sVar10 != local_d0);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&local_60);
  return (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)
         (__uniq_ptr_data<pg::Game,_std::default_delete<pg::Game>,_true,_true>)_Var5._M_head_impl;
}

Assistant:

std::unique_ptr<Game>
Game::extract_subgame(const bitset& mask, std::vector<int>& subgame_to_game)
{
    // check if there are any dead ends (not allowed)
    // also count the number of edges in the subgame

    int nv = mask.count();
    int ne = 0;
    for (int v=0; v<n_vertices; v++) {
        if (mask[v]) {
            bool bad = true;
            for (auto curedge = outs(v); *curedge != -1; curedge++) {
                if (mask[*curedge]) {
                    bad = false;
                    ne++;
                }
            }
            if (bad) {
                std::cerr << "no successor for vertex " << label_vertex(v) << " in extract_subgame!" << std::endl;
                std::cerr << "successors not in subgame:";
                for (auto curedge = outs(v); *curedge != -1; curedge++) {
                    std::cerr << " " << label_vertex(*curedge);
                }
                std::cerr << std::endl;
                abort(); // bad!
            }
        }
    }

    auto res = std::make_unique<Game>(nv, ne);

    // create mapping from game to subgame
    // also count the number of vertices in the subgame
    std::map<int, int> game_to_subgame;
    subgame_to_game.assign(n_vertices, 0);

    int vertices = 0;
    for (int v=0; v<n_vertices; v++) {
        if (!mask[v]) continue;

        // update game_to_subgame and subgame_to_game
        int w = vertices++;
        subgame_to_game[w] = v;
        game_to_subgame[v] = w;

        // initialize most stuff (except edges)
        if (_label[v] != 0) res->init_vertex(w, _priority[v], _owner[v], *_label[v]);
        else res->init_vertex(w, _priority[v], _owner[v], "");
    }

    // now add all edges

    for (int w=0; w<nv; w++) {
        int v = subgame_to_game[w];
        res->e_start(w);
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            if (mask[*curedge]) res->e_add(w, game_to_subgame[*curedge]);
        }
        res->e_finish();
    }

    // TODO: fix is_ordered?

    return res;
}